

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void expr(Vm *vm)

{
  Compiler *pCVar1;
  Scanner *scanner;
  Token *pTVar2;
  uint32_t *puVar3;
  TokenType TVar4;
  char *pcVar5;
  size_t sVar6;
  Token identifier;
  VarHTItemKey key;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined4 uVar10;
  uint32_t uVar11;
  CallFrame *frame;
  ObjLambda *object;
  uint8_t instruction;
  CrispyValue value;
  Variable value_00;
  CrispyValue CVar12;
  Token param;
  undefined4 in_stack_ffffffffffffff88;
  VarHashTable *pVVar13;
  Token *pTVar14;
  Token local_50;
  
  TVar4 = (vm->compiler).token.type;
  if ((int)TVar4 < 0x18) {
    if (TVar4 == TOKEN_IDENTIFIER) {
      assignment(vm);
      return;
    }
    if (TVar4 == TOKEN_OPEN_BRACE) {
      block_expr(vm);
      return;
    }
  }
  else {
    if (TVar4 == TOKEN_IF) {
      if_expr(vm);
      return;
    }
    if (TVar4 == TOKEN_FUN) {
      pCVar1 = &vm->compiler;
      TVar4 = (pCVar1->token).type;
      uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar5 = (vm->compiler).token.start;
      uVar11 = (vm->compiler).token.line;
      uVar10 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      (vm->compiler).previous.length = (vm->compiler).token.length;
      (vm->compiler).previous.line = uVar11;
      *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar10;
      (vm->compiler).previous.type = TVar4;
      *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar7;
      (vm->compiler).previous.start = pcVar5;
      uVar10 = *(undefined4 *)&(vm->compiler).next.field_0x4;
      pcVar5 = (vm->compiler).next.start;
      sVar6 = (vm->compiler).next.length;
      uVar11 = (vm->compiler).next.line;
      uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = (vm->compiler).next.type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar10;
      (vm->compiler).token.start = pcVar5;
      (vm->compiler).token.length = sVar6;
      (vm->compiler).token.line = uVar11;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
      scanner = &(vm->compiler).scanner;
      scan_token(&local_50,scanner);
      (vm->compiler).next.length = local_50.length;
      (vm->compiler).next.line = local_50.line;
      *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
      (vm->compiler).next.type = local_50.type;
      *(undefined4 *)&(vm->compiler).next.field_0x4 = local_50._4_4_;
      (vm->compiler).next.start = local_50.start;
      uVar9 = (vm->compiler).scope_depth + 1;
      (vm->compiler).scope_depth = uVar9;
      pVVar13 = (vm->compiler).scope;
      var_ht_init((vm->compiler).scope + uVar9,8);
      uVar10 = 0;
      frame = new_call_frame();
      uVar11 = vm->frame_count;
      vm->frame_count = uVar11 + 1;
      frames_write_at(&vm->frames,uVar11,frame);
      if ((vm->compiler).token.type != TOKEN_ARROW) {
        pTVar14 = &(vm->compiler).previous;
        pTVar2 = &(vm->compiler).next;
        uVar10 = (undefined4)CONCAT71((int7)((ulong)pTVar14 >> 8),1);
        while( true ) {
          consume(&local_50,vm,TOKEN_IDENTIFIER,"Expected parameter name");
          key.ident_length = local_50.length;
          key.key_ident_string = local_50.start;
          uVar11 = (vm->compiler).vars_in_scope;
          (vm->compiler).vars_in_scope = uVar11 + 1;
          uVar9 = (vm->compiler).scope_depth;
          value_00.scope = uVar9;
          value_00.index = uVar11;
          value_00._8_8_ = (ulong)vm->frame_count | 0x100000000;
          var_ht_put(pVVar13 + uVar9,key,value_00);
          identifier._4_4_ = uVar10;
          identifier.type = in_stack_ffffffffffffff88;
          identifier.start = (char *)pVVar13;
          identifier.length = (size_t)frame;
          identifier._24_8_ = pTVar14;
          define_var(vm,identifier);
          if ((vm->compiler).token.type != TOKEN_COMMA) break;
          TVar4 = (pCVar1->token).type;
          uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
          pcVar5 = (vm->compiler).token.start;
          uVar11 = (vm->compiler).token.line;
          uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          pTVar14->length = (vm->compiler).token.length;
          pTVar14->line = uVar11;
          *(undefined4 *)&pTVar14->field_0x1c = uVar7;
          pTVar14->type = TVar4;
          *(undefined4 *)&pTVar14->field_0x4 = uVar8;
          pTVar14->start = pcVar5;
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          pcVar5 = (vm->compiler).next.start;
          sVar6 = (vm->compiler).next.length;
          uVar11 = (vm->compiler).next.line;
          uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (pCVar1->token).type = pTVar2->type;
          *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
          (vm->compiler).token.start = pcVar5;
          (vm->compiler).token.length = sVar6;
          (vm->compiler).token.line = uVar11;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
          scan_token(&local_50,scanner);
          (vm->compiler).next.length = local_50.length;
          (vm->compiler).next.line = local_50.line;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
          pTVar2->type = local_50.type;
          *(undefined4 *)&pTVar2->field_0x4 = local_50._4_4_;
          (vm->compiler).next.start = local_50.start;
          uVar10 = CONCAT31((int3)((uint)uVar10 >> 8),(char)uVar10 + '\x01');
        }
      }
      consume(&local_50,vm,TOKEN_ARROW,"Expected \'->\' after parameter list");
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1b');
      expr(vm);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'1');
      vm->frame_count = vm->frame_count - 1;
      object = new_lambda(vm,(uint8_t)uVar10);
      object->call_frame = frame;
      frame->ip = (frame->code_buffer).code;
      CVar12 = create_object(&object->object);
      value.field_1 = CVar12.field_1;
      value._4_4_ = 0;
      value.type = CVar12.type;
      uVar11 = add_constant(vm,value);
      if ((uVar11 & 0xff00) == 0) {
        instruction = '\x12';
      }
      else {
        instruction = (uint8_t)(uVar11 >> 8);
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x13');
      }
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,instruction);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                        (uint8_t)uVar11);
      uVar9 = (vm->compiler).scope_depth;
      puVar3 = &(vm->compiler).vars_in_scope;
      *puVar3 = *puVar3 - pVVar13[uVar9].size;
      var_ht_free(pVVar13 + uVar9);
      puVar3 = &(vm->compiler).scope_depth;
      *puVar3 = *puVar3 - 1;
      return;
    }
  }
  logic_or(vm);
  return;
}

Assistant:

static void expr(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_FUN:
            lambda(vm);
            break;
        case TOKEN_OPEN_BRACE:
            block_expr(vm);
            break;
        case TOKEN_IF:
            if_expr(vm);
            break;
        case TOKEN_IDENTIFIER:
            assignment(vm);
            break;
        default:
            logic_or(vm);
            break;
    }
}